

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall
QMdi::SimpleCascader::rearrange(SimpleCascader *this,QList<QWidget_*> *widgets,QRect *domain)

{
  uint uVar1;
  int iVar2;
  QWidget *this_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  LayoutDirection direction;
  QStyle *pQVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  char *where;
  int iVar14;
  int iVar15;
  long in_FS_OFFSET;
  QFontMetrics fontMetrics;
  QStyleOptionTitleBar options;
  int local_104;
  int local_100;
  QRect local_d0;
  undefined1 *local_c0;
  QRect local_b8;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((widgets->d).size != 0) {
    local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)local_a8);
    QStyleOption::initFrom((QStyleOption *)local_a8,*(widgets->d).ptr);
    pQVar9 = QWidget::style(*(widgets->d).ptr);
    iVar4 = (**(code **)(*(long *)pQVar9 + 0xe0))
                      (pQVar9,0x1a,(QStyleOptionTitleBar *)local_a8,*(widgets->d).ptr);
    local_c0 = &DAT_aaaaaaaaaaaaaaaa;
    QApplication::font((QApplication *)&local_b8,"QMdiSubWindowTitleBar");
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_c0,(QFont *)&local_b8);
    QFont::~QFont((QFont *)&local_b8);
    iVar5 = QFontMetrics::height();
    iVar4 = iVar4 - (iVar4 - iVar5) / 2;
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    pQVar9 = QWidget::style(*(widgets->d).ptr);
    where = (char *)0x0;
    iVar6 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x40,0,*(widgets->d).ptr);
    uVar1 = (uint)(widgets->d).size;
    iVar5 = (domain->x2).m_i;
    iVar7 = (((domain->y2).m_i - (domain->y1).m_i) + -0x31) / (iVar6 + iVar4);
    if (iVar7 < 2) {
      iVar7 = 1;
    }
    iVar11 = ((int)uVar1 / iVar7 + 1) - (uint)((int)uVar1 % iVar7 == 0);
    if (iVar11 < 2) {
      iVar11 = 1;
    }
    iVar2 = (domain->x1).m_i;
    local_100 = -1;
    local_104 = 0;
    do {
      iVar8 = local_104 * (iVar6 + iVar4);
      iVar14 = iVar11;
      iVar15 = local_100;
      do {
        iVar12 = (int)where;
        bVar3 = sanityCheck((QList<QWidget_*> *)(widgets->d).ptr,(int)(widgets->d).size,where);
        if (bVar3) {
          uVar13 = iVar12 + 1;
          where = (char *)(ulong)uVar13;
          this_00 = (widgets->d).ptr[iVar12];
          local_b8.x1.m_i = -0x55555556;
          local_b8.y1.m_i = -0x55555556;
          local_b8.x2.m_i = -0x55555556;
          local_b8.y2.m_i = -0x55555556;
          uVar10 = (**(code **)(*(long *)this_00 + 0x70))(this_00);
          local_b8.x2.m_i = (int)uVar10 + iVar15;
          local_b8.y2.m_i = (int)((ulong)uVar10 >> 0x20) + iVar8 + -1;
          local_b8.x1.m_i = iVar15 + 1;
          local_b8.y1.m_i = iVar8;
          direction = QWidget::layoutDirection(this_00);
          local_d0 = QStyle::visualRect(direction,domain,&local_b8);
          QWidget::setGeometry(this_00,&local_d0);
          if (uVar13 == uVar1) goto LAB_0043dd5e;
        }
        iVar15 = iVar15 + ((iVar5 - iVar2) + -99) / iVar11;
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
      local_104 = local_104 + 1;
      local_100 = local_100 + 10;
    } while (local_104 != iVar7);
LAB_0043dd5e:
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_c0);
    QIcon::~QIcon(&local_48);
    if (pQStack_60 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_60,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SimpleCascader::rearrange(QList<QWidget *> &widgets, const QRect &domain) const
{
    if (widgets.isEmpty())
        return;

    // Tunables:
    const int topOffset = 0;
    const int bottomOffset = 50;
    const int leftOffset = 0;
    const int rightOffset = 100;
    const int dx = 10;

    QStyleOptionTitleBar options;
    options.initFrom(widgets.at(0));
    int titleBarHeight = widgets.at(0)->style()->pixelMetric(QStyle::PM_TitleBarHeight, &options, widgets.at(0));
    const QFontMetrics fontMetrics = QFontMetrics(QApplication::font("QMdiSubWindowTitleBar"));
    const int dy = qMax(titleBarHeight - (titleBarHeight - fontMetrics.height()) / 2, 1)
        + widgets.at(0)->style()->pixelMetric(QStyle::PM_FocusFrameVMargin, nullptr, widgets.at(0));

    const int n = widgets.size();
    const int nrows = qMax((domain.height() - (topOffset + bottomOffset)) / dy, 1);
    const int ncols = qMax(n / nrows + ((n % nrows) ? 1 : 0), 1);
    const int dcol = (domain.width() - (leftOffset + rightOffset)) / ncols;

    int i = 0;
    for (int row = 0; row < nrows; ++row) {
        for (int col = 0; col < ncols; ++col) {
            const int x = leftOffset + row * dx + col * dcol;
            const int y = topOffset + row * dy;
            if (!sanityCheck(widgets, i, "SimpleCascader"))
                continue;
            QWidget *widget = widgets.at(i++);
            QRect newGeometry = QRect(QPoint(x, y), widget->sizeHint());
            widget->setGeometry(QStyle::visualRect(widget->layoutDirection(), domain, newGeometry));
            if (i == n)
                return;
        }
    }
}